

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::write(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  format_error *this_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *it;
  undefined4 in_register_00000034;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  bVar2.container._4_4_ = in_register_00000034;
  bVar2.container._0_4_ = __fd;
  if (bVar2.container != (buffer<char> *)0x0) {
    pcVar1 = (char *)strlen((char *)bVar2.container);
    if (this->specs_ == (format_specs *)0x0) {
      bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (bVar2.container,pcVar1 + (long)bVar2.container,(this->out_).container);
    }
    else {
      s.size_ = (size_t)this->specs_;
      s.data_ = pcVar1;
      bVar2 = write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        ((this->out_).container,bVar2,s,in_R8);
    }
    (this->out_).container = bVar2.container;
    return (ssize_t)bVar2.container;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"string pointer is null");
  __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

void write(const Char* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? write(sv, *specs_) : write(sv);
    }
  }